

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegistryAccess.cpp
# Opt level: O2

vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> * __thiscall
bhf::ads::RegistryAccess::Enumerate
          (vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>
           *__return_storage_ptr__,RegistryAccess *this,RegistryEntry *key,uint32_t regFlag,
          size_t bufferSize)

{
  long adsErrorCode;
  runtime_error *this_00;
  AdsException *this_01;
  uint32_t indexOffset;
  bool bVar1;
  bool bVar2;
  uint32_t bytesRead;
  vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> *local_90;
  AdsDevice *local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  RegistryEntry local_68;
  
  (__return_storage_ptr__->
  super__Vector_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  indexOffset = regFlag;
  local_90 = __return_storage_ptr__;
  local_88 = &this->device;
  bVar1 = false;
  do {
    if ((indexOffset & 0xc0000000) != regFlag) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"overflow in offset detected");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bytesRead = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&data,bufferSize,(allocator_type *)&local_68);
    adsErrorCode = AdsDevice::ReadWriteReqEx2
                             (local_88,key->hive,indexOffset,bufferSize,
                              data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                              ._M_impl.super__Vector_impl_data._M_start,key->keyLen,
                              (key->buffer).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,&bytesRead);
    bVar2 = true;
    if (adsErrorCode != 0x70c) {
      if (adsErrorCode != 0) {
        this_01 = (AdsException *)__cxa_allocate_exception(0x30);
        AdsException::AdsException(this_01,adsErrorCode);
        __cxa_throw(this_01,&AdsException::typeinfo,AdsException::~AdsException);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&data,(ulong)bytesRead);
      RegistryEntry::Create(&local_68,&data,key->hive,regFlag);
      std::vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::
      emplace_back<bhf::ads::RegistryEntry>(local_90,&local_68);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
      bVar2 = bVar1;
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    indexOffset = indexOffset + 1;
    bVar1 = bVar2;
  } while (adsErrorCode != 0x70c);
  if (!bVar2) {
    std::vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::~vector
              (local_90);
  }
  return local_90;
}

Assistant:

std::vector<RegistryEntry> RegistryAccess::Enumerate(const RegistryEntry& key, const uint32_t regFlag,
                                                     const size_t bufferSize) const
{
    std::vector<RegistryEntry> entries;
    for (auto offset = regFlag; (offset & REGFLAG_ENUMVALUE_MASK) == regFlag; ++offset) {
        uint32_t bytesRead = 0;
        std::vector<uint8_t> data(bufferSize);
        const auto ret = device.ReadWriteReqEx2(key.hive,
                                                offset,
                                                bufferSize,
                                                data.data(),
                                                key.keyLen,
                                                key.buffer.data(),
                                                &bytesRead);
        if (ret == ADSERR_DEVICE_NOTFOUND) {
            // ADS_ERR_DEVICE_NOTFOUND is returned once the enumeration is exhausted.
            return entries;
        } else if (ret) {
            throw AdsException(ret);
        }
        data.resize(bytesRead);
        entries.push_back(RegistryEntry::Create(std::move(data), key.hive, regFlag));
    }
    throw std::runtime_error("overflow in offset detected");
}